

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O3

Expected<llvm::DWARFDebugRnglist> * __thiscall
llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::findList
          (Expected<llvm::DWARFDebugRnglist> *__return_storage_ptr__,
          DWARFListTableBase<llvm::DWARFDebugRnglist> *this,DWARFDataExtractor Data,uint64_t Offset)

{
  _Rb_tree_header *p_Var1;
  uint64_t uVar2;
  _Base_ptr p_Var3;
  uint64_t uVar4;
  mapped_type *this_00;
  _Base_ptr p_Var5;
  size_t in_R9;
  StringRef SectionName;
  uint64_t local_70;
  uint64_t Offset_local;
  uint64_t StartingOffset;
  vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> local_58;
  Error local_40;
  pointer local_38;
  
  p_Var3 = (this->ListMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_70 = Offset;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->ListMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var3 + 1) >= Offset) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < Offset];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(ulong *)(p_Var5 + 1) <= Offset)) {
      __return_storage_ptr__->field_0x18 = __return_storage_ptr__->field_0x18 & 0xfe;
      std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::vector
                ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)
                 __return_storage_ptr__,
                 (vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)
                 &p_Var5[1]._M_parent);
      return __return_storage_ptr__;
    }
  }
  local_58.super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = (this->Header).HeaderOffset;
  StartingOffset = (uint64_t)__return_storage_ptr__;
  uVar4 = DWARFListTableHeader::length(&this->Header);
  SectionName.Length = in_R9;
  SectionName.Data = (char *)&local_70;
  Offset_local = Offset;
  DWARFListType<llvm::RangeListEntry>::extract
            ((DWARFListType<llvm::RangeListEntry> *)&local_38,Data,(uint64_t)&local_58,
             (this->Header).HeaderOffset,(uint64_t *)(uVar2 + uVar4),SectionName,
             (this->Header).SectionName);
  uVar2 = StartingOffset;
  if ((pointer)&DAT_00000001 < local_38) {
    local_40.Payload = (ErrorInfoBase *)((ulong)local_38 | 1);
    local_38 = (pointer)0x0;
    Expected<llvm::DWARFDebugRnglist>::Expected
              ((Expected<llvm::DWARFDebugRnglist> *)StartingOffset,&local_40);
    if ((long *)((ulong)local_40.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_40.Payload & 0xfffffffffffffffe) + 8))();
    }
    if ((long *)((ulong)local_38 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_38 & 0xfffffffffffffffe) + 8))();
    }
    if (local_58.super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    this_00 = std::
              map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
              ::operator[](&this->ListMap,&Offset_local);
    std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::operator=
              ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)this_00,
               &local_58);
    *(byte *)(uVar2 + 0x18) = *(byte *)(uVar2 + 0x18) & 0xfe;
    *(pointer *)uVar2 =
         local_58.super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(uVar2 + 8) =
         local_58.super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(uVar2 + 0x10) =
         local_58.super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  return (Expected<llvm::DWARFDebugRnglist> *)uVar2;
}

Assistant:

Expected<DWARFListType>
DWARFListTableBase<DWARFListType>::findList(DWARFDataExtractor Data,
                                            uint64_t Offset) {
  auto Entry = ListMap.find(Offset);
  if (Entry != ListMap.end())
    return Entry->second;

  // Extract the list from the section and enter it into the list map.
  DWARFListType List;
  uint64_t End = getHeaderOffset() + Header.length();
  uint64_t StartingOffset = Offset;
  if (Error E =
          List.extract(Data, getHeaderOffset(), End, &Offset,
                       Header.getSectionName(), Header.getListTypeString()))
    return std::move(E);
  ListMap[StartingOffset] = List;
  return List;
}